

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::
MessageDifferencerTest_RepeatedFieldMapTest_MultipleFieldPathsAsKey_Test::TestBody
          (MessageDifferencerTest_RepeatedFieldMapTest_MultipleFieldPathsAsKey_Test *this)

{
  byte *pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  RepeatedPtrFieldBase *this_00;
  RepeatedPtrFieldBase *this_01;
  long lVar3;
  bool bVar4;
  void *pvVar5;
  void *pvVar6;
  FieldDescriptor *pFVar7;
  Arena *pAVar8;
  char *message;
  char *in_R9;
  pointer *__ptr_2;
  pointer *__ptr;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  string_view value_04;
  string_view value_05;
  string_view value_06;
  string output;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  key_field_path1;
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  key_field_paths;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  key_field_path2;
  TestDiffMessage msg1;
  TestDiffMessage msg2;
  MessageDifferencer differencer;
  string local_3f0;
  AssertHelper local_3d0;
  Message local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3c0;
  undefined1 local_3b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  value_type local_398;
  anon_union_8_2_3066aaf9_for_type_descriptor_ local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  AssertHelper local_360;
  anon_union_8_10_579a0ab3_for_FieldDescriptor_27 local_358;
  undefined8 uStack_350;
  long local_348;
  undefined1 local_340 [184];
  undefined1 local_288 [184];
  MessageDifferencer local_1d0;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_340,(Arena *)0x0);
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_288,(Arena *)0x0);
  this_00 = (RepeatedPtrFieldBase *)(local_340 + 0x30);
  pvVar5 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (this_00,Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 2;
  if (*(long *)((long)pvVar5 + 0x90) == 0) {
    pAVar8 = *(Arena **)((long)pvVar5 + 8);
    if (((ulong)pAVar8 & 1) != 0) {
      pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
    }
    pvVar6 = Arena::DefaultConstruct<proto2_unittest::TestField>(pAVar8);
    *(void **)((long)pvVar5 + 0x90) = pvVar6;
  }
  lVar3 = *(long *)((long)pvVar5 + 0x90);
  *(undefined4 *)(lVar3 + 0x4c) = 1;
  pbVar1 = (byte *)(lVar3 + 0x10);
  *pbVar1 = *pbVar1 | 4;
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 2;
  if (*(long *)((long)pvVar5 + 0x90) == 0) {
    pAVar8 = *(Arena **)((long)pvVar5 + 8);
    if (((ulong)pAVar8 & 1) != 0) {
      pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
    }
    pvVar6 = Arena::DefaultConstruct<proto2_unittest::TestField>(pAVar8);
    *(void **)((long)pvVar5 + 0x90) = pvVar6;
  }
  RepeatedField<int>::Add((RepeatedField<int> *)(*(long *)((long)pvVar5 + 0x90) + 0x18),2);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 2;
  if (*(long *)((long)pvVar5 + 0x90) == 0) {
    pAVar8 = *(Arena **)((long)pvVar5 + 8);
    if (((ulong)pAVar8 & 1) != 0) {
      pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
    }
    pvVar6 = Arena::DefaultConstruct<proto2_unittest::TestField>(pAVar8);
    *(void **)((long)pvVar5 + 0x90) = pvVar6;
  }
  RepeatedField<int>::Add((RepeatedField<int> *)(*(long *)((long)pvVar5 + 0x90) + 0x18),3);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 1;
  pAVar8 = *(Arena **)((long)pvVar5 + 8);
  if (((ulong)pAVar8 & 1) != 0) {
    pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
  }
  value._M_str = "a";
  value._M_len = 1;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar5 + 0x88),value,pAVar8);
  pvVar5 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (this_00,Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 2;
  if (*(long *)((long)pvVar5 + 0x90) == 0) {
    pAVar8 = *(Arena **)((long)pvVar5 + 8);
    if (((ulong)pAVar8 & 1) != 0) {
      pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
    }
    pvVar6 = Arena::DefaultConstruct<proto2_unittest::TestField>(pAVar8);
    *(void **)((long)pvVar5 + 0x90) = pvVar6;
  }
  lVar3 = *(long *)((long)pvVar5 + 0x90);
  *(undefined4 *)(lVar3 + 0x4c) = 2;
  pbVar1 = (byte *)(lVar3 + 0x10);
  *pbVar1 = *pbVar1 | 4;
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 2;
  if (*(long *)((long)pvVar5 + 0x90) == 0) {
    pAVar8 = *(Arena **)((long)pvVar5 + 8);
    if (((ulong)pAVar8 & 1) != 0) {
      pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
    }
    pvVar6 = Arena::DefaultConstruct<proto2_unittest::TestField>(pAVar8);
    *(void **)((long)pvVar5 + 0x90) = pvVar6;
  }
  RepeatedField<int>::Add((RepeatedField<int> *)(*(long *)((long)pvVar5 + 0x90) + 0x18),1);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 2;
  if (*(long *)((long)pvVar5 + 0x90) == 0) {
    pAVar8 = *(Arena **)((long)pvVar5 + 8);
    if (((ulong)pAVar8 & 1) != 0) {
      pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
    }
    pvVar6 = Arena::DefaultConstruct<proto2_unittest::TestField>(pAVar8);
    *(void **)((long)pvVar5 + 0x90) = pvVar6;
  }
  RepeatedField<int>::Add((RepeatedField<int> *)(*(long *)((long)pvVar5 + 0x90) + 0x18),3);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 1;
  pAVar8 = *(Arena **)((long)pvVar5 + 8);
  if (((ulong)pAVar8 & 1) != 0) {
    pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
  }
  value_00._M_str = "b";
  value_00._M_len = 1;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar5 + 0x88),value_00,pAVar8);
  pvVar5 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (this_00,Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 2;
  if (*(long *)((long)pvVar5 + 0x90) == 0) {
    pAVar8 = *(Arena **)((long)pvVar5 + 8);
    if (((ulong)pAVar8 & 1) != 0) {
      pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
    }
    pvVar6 = Arena::DefaultConstruct<proto2_unittest::TestField>(pAVar8);
    *(void **)((long)pvVar5 + 0x90) = pvVar6;
  }
  lVar3 = *(long *)((long)pvVar5 + 0x90);
  *(undefined4 *)(lVar3 + 0x4c) = 1;
  pbVar1 = (byte *)(lVar3 + 0x10);
  *pbVar1 = *pbVar1 | 4;
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 2;
  if (*(long *)((long)pvVar5 + 0x90) == 0) {
    pAVar8 = *(Arena **)((long)pvVar5 + 8);
    if (((ulong)pAVar8 & 1) != 0) {
      pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
    }
    pvVar6 = Arena::DefaultConstruct<proto2_unittest::TestField>(pAVar8);
    *(void **)((long)pvVar5 + 0x90) = pvVar6;
  }
  RepeatedField<int>::Add((RepeatedField<int> *)(*(long *)((long)pvVar5 + 0x90) + 0x18),1);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 2;
  if (*(long *)((long)pvVar5 + 0x90) == 0) {
    pAVar8 = *(Arena **)((long)pvVar5 + 8);
    if (((ulong)pAVar8 & 1) != 0) {
      pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
    }
    pvVar6 = Arena::DefaultConstruct<proto2_unittest::TestField>(pAVar8);
    *(void **)((long)pvVar5 + 0x90) = pvVar6;
  }
  RepeatedField<int>::Add((RepeatedField<int> *)(*(long *)((long)pvVar5 + 0x90) + 0x18),3);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 1;
  pAVar8 = *(Arena **)((long)pvVar5 + 8);
  if (((ulong)pAVar8 & 1) != 0) {
    pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
  }
  value_01._M_str = "c";
  value_01._M_len = 1;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar5 + 0x88),value_01,pAVar8);
  this_01 = (RepeatedPtrFieldBase *)(local_288 + 0x30);
  pvVar5 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (this_01,Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 2;
  if (*(long *)((long)pvVar5 + 0x90) == 0) {
    pAVar8 = *(Arena **)((long)pvVar5 + 8);
    if (((ulong)pAVar8 & 1) != 0) {
      pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
    }
    pvVar6 = Arena::DefaultConstruct<proto2_unittest::TestField>(pAVar8);
    *(void **)((long)pvVar5 + 0x90) = pvVar6;
  }
  lVar3 = *(long *)((long)pvVar5 + 0x90);
  *(undefined4 *)(lVar3 + 0x4c) = 1;
  pbVar1 = (byte *)(lVar3 + 0x10);
  *pbVar1 = *pbVar1 | 4;
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 2;
  if (*(long *)((long)pvVar5 + 0x90) == 0) {
    pAVar8 = *(Arena **)((long)pvVar5 + 8);
    if (((ulong)pAVar8 & 1) != 0) {
      pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
    }
    pvVar6 = Arena::DefaultConstruct<proto2_unittest::TestField>(pAVar8);
    *(void **)((long)pvVar5 + 0x90) = pvVar6;
  }
  RepeatedField<int>::Add((RepeatedField<int> *)(*(long *)((long)pvVar5 + 0x90) + 0x18),3);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 2;
  if (*(long *)((long)pvVar5 + 0x90) == 0) {
    pAVar8 = *(Arena **)((long)pvVar5 + 8);
    if (((ulong)pAVar8 & 1) != 0) {
      pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
    }
    pvVar6 = Arena::DefaultConstruct<proto2_unittest::TestField>(pAVar8);
    *(void **)((long)pvVar5 + 0x90) = pvVar6;
  }
  RepeatedField<int>::Add((RepeatedField<int> *)(*(long *)((long)pvVar5 + 0x90) + 0x18),1);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 1;
  pAVar8 = *(Arena **)((long)pvVar5 + 8);
  if (((ulong)pAVar8 & 1) != 0) {
    pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
  }
  value_02._M_str = "c";
  value_02._M_len = 1;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar5 + 0x88),value_02,pAVar8);
  pvVar5 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (this_01,Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 2;
  if (*(long *)((long)pvVar5 + 0x90) == 0) {
    pAVar8 = *(Arena **)((long)pvVar5 + 8);
    if (((ulong)pAVar8 & 1) != 0) {
      pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
    }
    pvVar6 = Arena::DefaultConstruct<proto2_unittest::TestField>(pAVar8);
    *(void **)((long)pvVar5 + 0x90) = pvVar6;
  }
  lVar3 = *(long *)((long)pvVar5 + 0x90);
  *(undefined4 *)(lVar3 + 0x4c) = 1;
  pbVar1 = (byte *)(lVar3 + 0x10);
  *pbVar1 = *pbVar1 | 4;
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 2;
  if (*(long *)((long)pvVar5 + 0x90) == 0) {
    pAVar8 = *(Arena **)((long)pvVar5 + 8);
    if (((ulong)pAVar8 & 1) != 0) {
      pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
    }
    pvVar6 = Arena::DefaultConstruct<proto2_unittest::TestField>(pAVar8);
    *(void **)((long)pvVar5 + 0x90) = pvVar6;
  }
  RepeatedField<int>::Add((RepeatedField<int> *)(*(long *)((long)pvVar5 + 0x90) + 0x18),3);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 2;
  if (*(long *)((long)pvVar5 + 0x90) == 0) {
    pAVar8 = *(Arena **)((long)pvVar5 + 8);
    if (((ulong)pAVar8 & 1) != 0) {
      pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
    }
    pvVar6 = Arena::DefaultConstruct<proto2_unittest::TestField>(pAVar8);
    *(void **)((long)pvVar5 + 0x90) = pvVar6;
  }
  RepeatedField<int>::Add((RepeatedField<int> *)(*(long *)((long)pvVar5 + 0x90) + 0x18),2);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 1;
  pAVar8 = *(Arena **)((long)pvVar5 + 8);
  if (((ulong)pAVar8 & 1) != 0) {
    pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
  }
  value_03._M_str = "a";
  value_03._M_len = 1;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar5 + 0x88),value_03,pAVar8);
  pvVar5 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (this_01,Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 2;
  if (*(long *)((long)pvVar5 + 0x90) == 0) {
    pAVar8 = *(Arena **)((long)pvVar5 + 8);
    if (((ulong)pAVar8 & 1) != 0) {
      pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
    }
    pvVar6 = Arena::DefaultConstruct<proto2_unittest::TestField>(pAVar8);
    *(void **)((long)pvVar5 + 0x90) = pvVar6;
  }
  lVar3 = *(long *)((long)pvVar5 + 0x90);
  *(undefined4 *)(lVar3 + 0x4c) = 2;
  pbVar1 = (byte *)(lVar3 + 0x10);
  *pbVar1 = *pbVar1 | 4;
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 2;
  if (*(long *)((long)pvVar5 + 0x90) == 0) {
    pAVar8 = *(Arena **)((long)pvVar5 + 8);
    if (((ulong)pAVar8 & 1) != 0) {
      pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
    }
    pvVar6 = Arena::DefaultConstruct<proto2_unittest::TestField>(pAVar8);
    *(void **)((long)pvVar5 + 0x90) = pvVar6;
  }
  RepeatedField<int>::Add((RepeatedField<int> *)(*(long *)((long)pvVar5 + 0x90) + 0x18),3);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 2;
  if (*(long *)((long)pvVar5 + 0x90) == 0) {
    pAVar8 = *(Arena **)((long)pvVar5 + 8);
    if (((ulong)pAVar8 & 1) != 0) {
      pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
    }
    pvVar6 = Arena::DefaultConstruct<proto2_unittest::TestField>(pAVar8);
    *(void **)((long)pvVar5 + 0x90) = pvVar6;
  }
  RepeatedField<int>::Add((RepeatedField<int> *)(*(long *)((long)pvVar5 + 0x90) + 0x18),1);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 1;
  pAVar8 = *(Arena **)((long)pvVar5 + 8);
  if (((ulong)pAVar8 & 1) != 0) {
    pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
  }
  value_04._M_str = "b";
  value_04._M_len = 1;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar5 + 0x88),value_04,pAVar8);
  util::MessageDifferencer::MessageDifferencer(&local_1d0);
  paVar2 = &local_3f0.field_2;
  local_3f0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"item.m.rc","");
  pFVar7 = GetFieldDescriptor((Message *)local_340,&local_3f0);
  util::MessageDifferencer::TreatAsSet(&local_1d0,pFVar7);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f0._M_dataplus._M_p,
                    CONCAT71(local_3f0.field_2._M_allocated_capacity._1_7_,
                             local_3f0.field_2._M_local_buf[0]) + 1);
  }
  bVar4 = util::MessageDifferencer::Compare(&local_1d0,(Message *)local_340,(Message *)local_288);
  local_3b8[0] = (internal)!bVar4;
  local_3b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar4) {
    testing::Message::Message((Message *)&local_378);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3f0,(internal *)local_3b8,(AssertionResult *)0x126d6fd,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_398,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x8c5,local_3f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_398,(Message *)&local_378);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_398);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != paVar2) {
      operator_delete(local_3f0._M_dataplus._M_p,
                      CONCAT71(local_3f0.field_2._M_allocated_capacity._1_7_,
                               local_3f0.field_2._M_local_buf[0]) + 1);
    }
    if (local_378.message_type != (Descriptor *)0x0) {
      (**(code **)(*(long *)local_378.message_type + 8))();
    }
  }
  if (local_3b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3b0,local_3b0);
  }
  local_368 = 0;
  local_378.message_type = (Descriptor *)0x0;
  uStack_370 = 0;
  local_398.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_398.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_398.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3f0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"item.m","");
  local_3b8 = (undefined1  [8])GetFieldDescriptor((Message *)local_340,&local_3f0);
  std::
  vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
  ::emplace_back<google::protobuf::FieldDescriptor_const*>
            ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
              *)&local_398,(FieldDescriptor **)local_3b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f0._M_dataplus._M_p,
                    CONCAT71(local_3f0.field_2._M_allocated_capacity._1_7_,
                             local_3f0.field_2._M_local_buf[0]) + 1);
  }
  local_3f0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"item.m.a","");
  local_3b8 = (undefined1  [8])GetFieldDescriptor((Message *)local_340,&local_3f0);
  std::
  vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
  ::emplace_back<google::protobuf::FieldDescriptor_const*>
            ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
              *)&local_398,(FieldDescriptor **)local_3b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f0._M_dataplus._M_p,
                    CONCAT71(local_3f0.field_2._M_allocated_capacity._1_7_,
                             local_3f0.field_2._M_local_buf[0]) + 1);
  }
  local_358.default_value_int64_t_ = 0;
  uStack_350 = 0;
  local_348 = 0;
  local_3f0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"item.m","");
  local_3b8 = (undefined1  [8])GetFieldDescriptor((Message *)local_340,&local_3f0);
  std::
  vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
  ::emplace_back<google::protobuf::FieldDescriptor_const*>
            ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
              *)&local_358.default_generated_instance_,(FieldDescriptor **)local_3b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f0._M_dataplus._M_p,
                    CONCAT71(local_3f0.field_2._M_allocated_capacity._1_7_,
                             local_3f0.field_2._M_local_buf[0]) + 1);
  }
  local_3f0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"item.m.rc","");
  local_3b8 = (undefined1  [8])GetFieldDescriptor((Message *)local_340,&local_3f0);
  std::
  vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
  ::emplace_back<google::protobuf::FieldDescriptor_const*>
            ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
              *)&local_358.default_generated_instance_,(FieldDescriptor **)local_3b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f0._M_dataplus._M_p,
                    CONCAT71(local_3f0.field_2._M_allocated_capacity._1_7_,
                             local_3f0.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ::push_back((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
               *)&local_378,&local_398);
  std::
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ::push_back((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
               *)&local_378,(value_type *)&local_358.default_generated_instance_);
  local_3f0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"item","");
  pFVar7 = GetFieldDescriptor((Message *)local_340,&local_3f0);
  util::MessageDifferencer::TreatAsMapWithMultipleFieldPathsAsKey
            (&local_1d0,pFVar7,
             (vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              *)&local_378);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f0._M_dataplus._M_p,
                    CONCAT71(local_3f0.field_2._M_allocated_capacity._1_7_,
                             local_3f0.field_2._M_local_buf[0]) + 1);
  }
  bVar4 = util::MessageDifferencer::Compare(&local_1d0,(Message *)local_340,(Message *)local_288);
  local_3b8[0] = (internal)bVar4;
  local_3b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar4) {
    testing::Message::Message(&local_3c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3f0,(internal *)local_3b8,(AssertionResult *)0x126d6fd,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x8d1,local_3f0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_3d0,&local_3c8);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != paVar2) {
      operator_delete(local_3f0._M_dataplus._M_p,
                      CONCAT71(local_3f0.field_2._M_allocated_capacity._1_7_,
                               local_3f0.field_2._M_local_buf[0]) + 1);
    }
    if ((long *)CONCAT71(local_3c8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_3c8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_3c8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_3c8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  if (local_3b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3b0,local_3b0);
  }
  protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>>
            (this_00);
  protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>>
            (this_01);
  pvVar5 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (this_00,Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 2;
  if (*(long *)((long)pvVar5 + 0x90) == 0) {
    pAVar8 = *(Arena **)((long)pvVar5 + 8);
    if (((ulong)pAVar8 & 1) != 0) {
      pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
    }
    pvVar6 = Arena::DefaultConstruct<proto2_unittest::TestField>(pAVar8);
    *(void **)((long)pvVar5 + 0x90) = pvVar6;
  }
  lVar3 = *(long *)((long)pvVar5 + 0x90);
  *(undefined4 *)(lVar3 + 0x4c) = 4;
  pbVar1 = (byte *)(lVar3 + 0x10);
  *pbVar1 = *pbVar1 | 4;
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 2;
  if (*(long *)((long)pvVar5 + 0x90) == 0) {
    pAVar8 = *(Arena **)((long)pvVar5 + 8);
    if (((ulong)pAVar8 & 1) != 0) {
      pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
    }
    pvVar6 = Arena::DefaultConstruct<proto2_unittest::TestField>(pAVar8);
    *(void **)((long)pvVar5 + 0x90) = pvVar6;
  }
  RepeatedField<int>::Add((RepeatedField<int> *)(*(long *)((long)pvVar5 + 0x90) + 0x18),5);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 2;
  if (*(long *)((long)pvVar5 + 0x90) == 0) {
    pAVar8 = *(Arena **)((long)pvVar5 + 8);
    if (((ulong)pAVar8 & 1) != 0) {
      pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
    }
    pvVar6 = Arena::DefaultConstruct<proto2_unittest::TestField>(pAVar8);
    *(void **)((long)pvVar5 + 0x90) = pvVar6;
  }
  RepeatedField<int>::Add((RepeatedField<int> *)(*(long *)((long)pvVar5 + 0x90) + 0x18),6);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 1;
  pAVar8 = *(Arena **)((long)pvVar5 + 8);
  if (((ulong)pAVar8 & 1) != 0) {
    pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
  }
  value_05._M_str = "hello";
  value_05._M_len = 5;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar5 + 0x88),value_05,pAVar8);
  pvVar5 = protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     (this_01,Arena::DefaultConstruct<proto2_unittest::TestDiffMessage_Item>);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 2;
  if (*(long *)((long)pvVar5 + 0x90) == 0) {
    pAVar8 = *(Arena **)((long)pvVar5 + 8);
    if (((ulong)pAVar8 & 1) != 0) {
      pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
    }
    pvVar6 = Arena::DefaultConstruct<proto2_unittest::TestField>(pAVar8);
    *(void **)((long)pvVar5 + 0x90) = pvVar6;
  }
  lVar3 = *(long *)((long)pvVar5 + 0x90);
  *(undefined4 *)(lVar3 + 0x4c) = 4;
  pbVar1 = (byte *)(lVar3 + 0x10);
  *pbVar1 = *pbVar1 | 4;
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 2;
  if (*(long *)((long)pvVar5 + 0x90) == 0) {
    pAVar8 = *(Arena **)((long)pvVar5 + 8);
    if (((ulong)pAVar8 & 1) != 0) {
      pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
    }
    pvVar6 = Arena::DefaultConstruct<proto2_unittest::TestField>(pAVar8);
    *(void **)((long)pvVar5 + 0x90) = pvVar6;
  }
  RepeatedField<int>::Add((RepeatedField<int> *)(*(long *)((long)pvVar5 + 0x90) + 0x18),6);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 2;
  if (*(long *)((long)pvVar5 + 0x90) == 0) {
    pAVar8 = *(Arena **)((long)pvVar5 + 8);
    if (((ulong)pAVar8 & 1) != 0) {
      pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
    }
    pvVar6 = Arena::DefaultConstruct<proto2_unittest::TestField>(pAVar8);
    *(void **)((long)pvVar5 + 0x90) = pvVar6;
  }
  RepeatedField<int>::Add((RepeatedField<int> *)(*(long *)((long)pvVar5 + 0x90) + 0x18),5);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 1;
  pAVar8 = *(Arena **)((long)pvVar5 + 8);
  if (((ulong)pAVar8 & 1) != 0) {
    pAVar8 = *(Arena **)((ulong)pAVar8 & 0xfffffffffffffffe);
  }
  value_06._M_str = "world";
  value_06._M_len = 5;
  protobuf::internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar5 + 0x88),value_06,pAVar8);
  local_3f0._M_string_length = 0;
  local_3f0.field_2._M_local_buf[0] = '\0';
  local_3f0._M_dataplus._M_p = (pointer)paVar2;
  util::MessageDifferencer::ReportDifferencesToString(&local_1d0,&local_3f0);
  bVar4 = util::MessageDifferencer::Compare(&local_1d0,(Message *)local_340,(Message *)local_288);
  local_3c8.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = (internal)!bVar4;
  local_3c0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar4) {
    testing::Message::Message((Message *)&local_3d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_3b8,(internal *)&local_3c8,(AssertionResult *)0x126d6fd,"true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x8e2,(char *)local_3b8);
    testing::internal::AssertHelper::operator=(&local_360,(Message *)&local_3d0);
    testing::internal::AssertHelper::~AssertHelper(&local_360);
    if (local_3b8 != (undefined1  [8])&local_3a8) {
      operator_delete((void *)local_3b8,local_3a8._M_allocated_capacity + 1);
    }
    if (local_3d0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_3d0.data_ + 8))();
    }
  }
  if (local_3c0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3c0,local_3c0);
  }
  testing::internal::CmpHelperEQ<char[133],std::__cxx11::string>
            ((internal *)local_3b8,
             "\"modified: item[0].b: \\\"hello\\\" -> \\\"world\\\"\\n\" \"moved: item[0].m.rc[0] -> item[0].m.rc[1] : 5\\n\" \"moved: item[0].m.rc[1] -> item[0].m.rc[0] : 6\\n\""
             ,"output",
             (char (*) [133])
             "modified: item[0].b: \"hello\" -> \"world\"\nmoved: item[0].m.rc[0] -> item[0].m.rc[1] : 5\nmoved: item[0].m.rc[1] -> item[0].m.rc[0] : 6\n"
             ,&local_3f0);
  if (local_3b8[0] == (internal)0x0) {
    testing::Message::Message(&local_3c8);
    if (local_3b0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message = (local_3b0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x8e7,message);
    testing::internal::AssertHelper::operator=(&local_3d0,&local_3c8);
    testing::internal::AssertHelper::~AssertHelper(&local_3d0);
    if ((long *)CONCAT71(local_3c8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_3c8.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_3c8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_3c8.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  if (local_3b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_3b0,local_3b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3f0._M_dataplus._M_p,
                    CONCAT71(local_3f0.field_2._M_allocated_capacity._1_7_,
                             local_3f0.field_2._M_local_buf[0]) + 1);
  }
  if (local_358 != (void *)0x0) {
    operator_delete(local_358.default_value_enum_,local_348 - (long)local_358);
  }
  if (local_398.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_398.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_398.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_398.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ::~vector((vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
             *)&local_378);
  util::MessageDifferencer::~MessageDifferencer(&local_1d0);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_288);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_340);
  return;
}

Assistant:

TEST(MessageDifferencerTest, RepeatedFieldMapTest_MultipleFieldPathsAsKey) {
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;
  // Treat "item" as Map, with key = ("m.a", "m.rc")
  // Treat "item.m.rc" as Set
  proto2_unittest::TestDiffMessage::Item* item = msg1.add_item();
  // key => value: (1, {2, 3}) => "a"
  item->mutable_m()->set_a(1);
  item->mutable_m()->add_rc(2);
  item->mutable_m()->add_rc(3);
  item->set_b("a");
  item = msg1.add_item();
  // key => value: (2, {1, 3}) => "b"
  item->mutable_m()->set_a(2);
  item->mutable_m()->add_rc(1);
  item->mutable_m()->add_rc(3);
  item->set_b("b");
  item = msg1.add_item();
  // key => value: (1, {1, 3}) => "c"
  item->mutable_m()->set_a(1);
  item->mutable_m()->add_rc(1);
  item->mutable_m()->add_rc(3);
  item->set_b("c");

  item = msg2.add_item();
  // key => value: (1, {1, 3}) => "c"
  item->mutable_m()->set_a(1);
  item->mutable_m()->add_rc(3);
  item->mutable_m()->add_rc(1);
  item->set_b("c");
  item = msg2.add_item();
  // key => value: (1, {2, 3}) => "a"
  item->mutable_m()->set_a(1);
  item->mutable_m()->add_rc(3);
  item->mutable_m()->add_rc(2);
  item->set_b("a");
  item = msg2.add_item();
  // key => value: (2, {1, 3}) => "b"
  item->mutable_m()->set_a(2);
  item->mutable_m()->add_rc(3);
  item->mutable_m()->add_rc(1);
  item->set_b("b");

  // Compare
  util::MessageDifferencer differencer;
  differencer.TreatAsSet(GetFieldDescriptor(msg1, "item.m.rc"));
  EXPECT_FALSE(differencer.Compare(msg1, msg2));
  std::vector<std::vector<const FieldDescriptor*> > key_field_paths;
  std::vector<const FieldDescriptor*> key_field_path1;
  key_field_path1.push_back(GetFieldDescriptor(msg1, "item.m"));
  key_field_path1.push_back(GetFieldDescriptor(msg1, "item.m.a"));
  std::vector<const FieldDescriptor*> key_field_path2;
  key_field_path2.push_back(GetFieldDescriptor(msg1, "item.m"));
  key_field_path2.push_back(GetFieldDescriptor(msg1, "item.m.rc"));
  key_field_paths.push_back(key_field_path1);
  key_field_paths.push_back(key_field_path2);
  differencer.TreatAsMapWithMultipleFieldPathsAsKey(
      GetFieldDescriptor(msg1, "item"), key_field_paths);
  EXPECT_TRUE(differencer.Compare(msg1, msg2));

  // Introduce some differences.
  msg1.clear_item();
  msg2.clear_item();
  item = msg1.add_item();
  item->mutable_m()->set_a(4);
  item->mutable_m()->add_rc(5);
  item->mutable_m()->add_rc(6);
  item->set_b("hello");
  item = msg2.add_item();
  item->mutable_m()->set_a(4);
  item->mutable_m()->add_rc(6);
  item->mutable_m()->add_rc(5);
  item->set_b("world");
  std::string output;
  differencer.ReportDifferencesToString(&output);
  EXPECT_FALSE(differencer.Compare(msg1, msg2));
  EXPECT_EQ(
      "modified: item[0].b: \"hello\" -> \"world\"\n"
      "moved: item[0].m.rc[0] -> item[0].m.rc[1] : 5\n"
      "moved: item[0].m.rc[1] -> item[0].m.rc[0] : 6\n",
      output);
}